

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode
JsGetProxyProperties(JsValueRef object,bool *isProxy,JsValueRef *target,JsValueRef *handler)

{
  ScriptContext *pSVar1;
  bool bVar2;
  JsErrorCode JVar3;
  JsrtContext *currentContext;
  RecyclableObject *pRVar4;
  JavascriptProxy *this;
  AutoNestedHandledExceptionType local_58 [2];
  TTDebuggerAbortException anon_var_0;
  
  currentContext = JsrtContext::GetCurrent();
  JVar3 = CheckContext(currentContext,false,true);
  if (JVar3 != JsNoError) {
    return JVar3;
  }
  anon_var_0.m_staticAbortMessage =
       (char16 *)
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (object == (JsValueRef)0x0) {
    JVar3 = JsErrorInvalidArgument;
  }
  else {
    if ((ulong)object >> 0x30 == 0) {
      pRVar4 = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((pRVar4->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != (ScriptContext *)anon_var_0.m_staticAbortMessage) {
        JVar3 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != *(ThreadContext **)(anon_var_0.m_staticAbortMessage + 0x1dc))
        goto LAB_003c7e20;
        object = Js::CrossSite::MarshalVar
                           ((ScriptContext *)anon_var_0.m_staticAbortMessage,pRVar4,false);
      }
    }
    if (isProxy == (bool *)0x0) {
      JVar3 = JsErrorNullArgument;
    }
    else {
      if (target != (JsValueRef *)0x0) {
        *target = (JsValueRef)0x0;
      }
      if (handler != (JsValueRef *)0x0) {
        *handler = (JsValueRef)0x0;
      }
      bVar2 = Js::VarIs<Js::JavascriptProxy>(object);
      *isProxy = bVar2;
      JVar3 = JsNoError;
      if (bVar2) {
        this = Js::UnsafeVarTo<Js::JavascriptProxy>(object);
        bVar2 = Js::JavascriptProxy::IsRevoked(this);
        if (target != (JsValueRef *)0x0 && !bVar2) {
          pRVar4 = Js::JavascriptProxy::GetTarget(this);
          *target = pRVar4;
        }
        if (handler != (JsValueRef *)0x0 && !bVar2) {
          pRVar4 = Js::JavascriptProxy::GetHandler(this);
          *handler = pRVar4;
          JVar3 = JsNoError;
        }
      }
    }
  }
LAB_003c7e20:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
  return JVar3;
}

Assistant:

CHAKRA_API JsGetProxyProperties(_In_ JsValueRef object, _Out_ bool* isProxy, _Out_opt_ JsValueRef* target, _Out_opt_ JsValueRef* handler)
{
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext * scriptContext) -> JsErrorCode {
        VALIDATE_INCOMING_REFERENCE(object, scriptContext);
        PARAM_NOT_NULL(isProxy);

        if (target != nullptr)
        {
            *target = JS_INVALID_REFERENCE;
        }

        if (handler != nullptr)
        {
            *handler = JS_INVALID_REFERENCE;
        }

        *isProxy = Js::VarIs<Js::JavascriptProxy>(object);

        if (!*isProxy)
        {
            return JsNoError;
        }

        Js::JavascriptProxy* proxy = Js::UnsafeVarTo<Js::JavascriptProxy>(object);
        bool revoked = proxy->IsRevoked();

        if (target != nullptr && !revoked)
        {
            *target = static_cast<JsValueRef>(proxy->GetTarget());
        }

        if (handler != nullptr && !revoked)
        {
            *handler = static_cast<JsValueRef>(proxy->GetHandler());
        }

        return JsNoError;
    },
        /*allowInObjectBeforeCollectCallback*/true);
}